

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revsurface.hpp
# Opt level: O0

vec3f __thiscall RevSurface::surface(RevSurface *this,float u,float v,vec3f *dpdu,vec3f *dpdv)

{
  undefined1 auVar1 [16];
  undefined8 *in_RDX;
  vec3f *in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float in_XMM1_Da;
  vec3f vVar5;
  mat4f rot;
  float s;
  float c;
  pair<vec3f,_vec3f> pnd;
  vec3f p;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffdf4;
  float fVar7;
  undefined4 in_stack_fffffffffffffdfc;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffe04;
  uint local_1c8;
  vec4f *in_stack_fffffffffffffe48;
  vec3f *this_00;
  undefined8 local_148;
  float local_140;
  vec3f local_138;
  vec3f local_12c [2];
  vec3f local_110;
  vec4f local_100;
  vec4f local_f0;
  undefined8 local_e0;
  float local_d8;
  vec3f local_d0;
  vec4f local_c0;
  vec4f local_b0;
  vec3f local_a0;
  mat4f local_90;
  float local_50;
  float local_4c;
  vec3f local_48;
  undefined8 local_3c;
  float local_34;
  undefined8 *local_30;
  vec3f *local_28;
  float local_20;
  float local_1c;
  vec3f local_10;
  
  this_00 = &local_10;
  local_30 = in_RDX;
  local_28 = in_RSI;
  local_20 = in_XMM1_Da;
  local_1c = in_XMM0_Da;
  vec3f::vec3f(this_00);
  (**(code **)**(undefined8 **)(in_RDI + 0x10))((double)local_1c,&local_48);
  local_10.z = local_48.z;
  local_10.x = local_48.x;
  local_10.y = local_48.y;
  local_28->z = local_34;
  local_28->x = (float)(undefined4)local_3c;
  auVar1 = _DAT_001bca60;
  local_28->y = (float)local_3c._4_4_;
  auVar3._4_12_ = SUB1612(ZEXT416((uint)local_20) ^ _DAT_001bca60,4);
  auVar3._0_4_ = (SUB164(ZEXT416((uint)local_20) ^ _DAT_001bca60,0) - local_20) * PI;
  dVar2 = std::cos(auVar3._0_8_);
  local_4c = SUB84(dVar2,0);
  auVar3 = ZEXT416((uint)local_20) ^ auVar1;
  auVar4._4_12_ = auVar3._4_12_;
  auVar4._0_4_ = (auVar3._0_4_ - local_20) * PI;
  dVar2 = std::sin(auVar4._0_8_);
  local_1c8 = auVar1._0_4_;
  local_50 = SUB84(dVar2,0);
  uVar8 = 0;
  uVar6 = 0;
  fVar7 = local_4c;
  mat4f::mat4f(&local_90,local_4c,0.0,(float)((uint)local_50 ^ local_1c8),0.0,0.0,1.0,0.0,0.0,
               local_50,0.0,local_4c,0.0,0.0,0.0,0.0,1.0);
  vec4f::vec4f(&local_c0,this_00,1.0);
  local_b0 = ::operator*((mat4f *)this_00,in_stack_fffffffffffffe48);
  local_d0 = vec4f::xyz((vec4f *)CONCAT44(in_stack_fffffffffffffdf4,uVar6));
  local_a0 = local_d0;
  local_10 = local_d0;
  vec4f::vec4f(&local_100,local_28,1.0);
  local_f0 = ::operator*((mat4f *)this_00,in_stack_fffffffffffffe48);
  vVar5 = vec4f::xyz((vec4f *)CONCAT44(in_stack_fffffffffffffdf4,uVar6));
  local_110.z = vVar5.z;
  local_d8 = local_110.z;
  local_110._0_8_ = vVar5._0_8_;
  local_e0._0_4_ = local_110.x;
  local_e0._4_4_ = local_110.y;
  local_28->z = local_110.z;
  local_28->x = local_110.x;
  local_28->y = local_110.y;
  local_110 = vVar5;
  vec3f::vec3f(local_12c,local_10.x,0.0,local_10.z);
  vec3f::vec3f(&local_138,0.0,PI * -2.0,0.0);
  vVar5 = cross((vec3f *)CONCAT44(in_stack_fffffffffffffe04,uVar8),
                (vec3f *)CONCAT44(in_stack_fffffffffffffdfc,fVar7));
  local_140 = vVar5.z;
  local_148 = vVar5._0_8_;
  *(float *)(local_30 + 1) = local_140;
  *local_30 = local_148;
  return local_10;
}

Assistant:

vec3f surface(float u, float v, vec3f& dpdu, vec3f& dpdv) const
	{
		vec3f p;
		auto pnd = curve->atParam(u);
		p = pnd.first;
		dpdu = pnd.second;
		// rotate around Y axis
	    float c = std::cos(-v*2*PI);
	    float s = std::sin(-v*2*PI);
		auto rot = mat4f(
	        c,  0, -s,  0,
	        0,  1,  0,  0,
	        s,  0,  c,  0,
	        0,  0,  0,  1
	    );
	    p = (rot * vec4f(p, 1)).xyz();
	    dpdu = (rot * vec4f(dpdu, 1)).xyz();
	    dpdv = cross(vec3f(p.x,0,p.z), vec3f(0,-2*PI,0));
	    return p;
	}